

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cpp
# Opt level: O2

int __thiscall
Bind::mount(Bind *this,char *__special_file,char *__dir,char *__fstype,ulong __rwflag,void *__data)

{
  path *ppVar1;
  uint uVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  undefined7 extraout_var;
  ContextManager *pCVar7;
  ulong uVar8;
  path *__p;
  error_code error;
  path local_b0;
  error_code local_88;
  path *local_78;
  string local_70;
  undefined8 local_50 [4];
  
  set_paths(this,(path *)__special_file,(path *)__dir);
  uVar2 = this->flags_;
  uVar6 = (ulong)(uVar2 & 1) ^ 0x5001;
  uVar8 = uVar6 + 4;
  if ((uVar2 & 2) != 0) {
    uVar8 = uVar6;
  }
  uVar6 = uVar8 + 2 + (ulong)(uVar2 & 4) * 2;
  if ((uVar2 & 8) != 0) {
    uVar6 = uVar8 + (ulong)(uVar2 & 4) * 2;
  }
  local_88._M_value = 0;
  local_88._M_cat = (error_category *)std::_V2::system_category();
  __p = &this->from_;
  bVar4 = std::filesystem::exists(__p,&local_88);
  if (!bVar4) {
    if ((uVar2 & 0x10) != 0) {
      return (int)CONCAT71(extraout_var,bVar4);
    }
    pCVar7 = ContextManager::get();
    format_abi_cxx11_(&local_b0._M_pathname,"%s not exists",(__p->_M_pathname)._M_dataplus._M_p);
    (**pCVar7->_vptr_ContextManager)(pCVar7,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  bVar4 = std::filesystem::is_directory(__p,&local_88);
  if (bVar4) {
    ppVar1 = &this->to_;
    std::filesystem::create_directories(ppVar1,&local_88);
    if (local_88._M_value != 0) {
      local_78 = __p;
      pCVar7 = ContextManager::get();
      pcVar3 = (ppVar1->_M_pathname)._M_dataplus._M_p;
      (**(code **)(*(long *)local_88._M_cat + 0x20))(&local_70,local_88._M_cat,local_88._M_value);
      format_abi_cxx11_(&local_b0._M_pathname,"Cannot create dir %s for mount point: %s",pcVar3,
                        local_70._M_dataplus._M_p);
      (**pCVar7->_vptr_ContextManager)(pCVar7,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_70);
      __p = local_78;
    }
    iVar5 = ::mount((__p->_M_pathname)._M_dataplus._M_p,(ppVar1->_M_pathname)._M_dataplus._M_p,
                    "none",uVar6,"");
    if (iVar5 < 0) {
      pCVar7 = ContextManager::get();
      format_abi_cxx11_(&local_b0._M_pathname,"Cannot mount %s: %m",
                        (ppVar1->_M_pathname)._M_dataplus._M_p);
      (**pCVar7->_vptr_ContextManager)(pCVar7,&local_b0);
LAB_00118348:
      iVar5 = std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  else {
    bVar4 = std::filesystem::is_regular_file(__p,&local_88);
    if (!bVar4) {
      pCVar7 = ContextManager::get();
      format_abi_cxx11_(&local_b0._M_pathname,"%s is not directory nor regular file",
                        (this->to_)._M_pathname._M_dataplus._M_p);
      (**pCVar7->_vptr_ContextManager)(pCVar7,&local_b0);
      iVar5 = std::__cxx11::string::~string((string *)&local_b0);
      goto LAB_00118393;
    }
    ppVar1 = &this->to_;
    std::filesystem::__cxx11::path::parent_path();
    std::filesystem::create_directories(&local_b0,&local_88);
    std::filesystem::__cxx11::path::~path(&local_b0);
    if (local_88._M_value != 0) {
      pCVar7 = ContextManager::get();
      local_78 = __p;
      std::filesystem::__cxx11::path::parent_path();
      (**(code **)(*(long *)local_88._M_cat + 0x20))(local_50,local_88._M_cat,local_88._M_value);
      format_abi_cxx11_(&local_70,"Cannot create dir %s: %s",local_b0._M_pathname._M_dataplus._M_p,
                        local_50[0]);
      (**pCVar7->_vptr_ContextManager)(pCVar7,&local_70);
      __p = local_78;
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)local_50);
      std::filesystem::__cxx11::path::~path(&local_b0);
    }
    iVar5 = open((ppVar1->_M_pathname)._M_dataplus._M_p,0x241);
    if (iVar5 < 0) {
      pCVar7 = ContextManager::get();
      format_abi_cxx11_(&local_b0._M_pathname,"Cannot create file %s for mount point: %m",
                        (ppVar1->_M_pathname)._M_dataplus._M_p);
      (**pCVar7->_vptr_ContextManager)(pCVar7,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    iVar5 = close(iVar5);
    if (iVar5 < 0) {
      pCVar7 = ContextManager::get();
      format_abi_cxx11_(&local_b0._M_pathname,"Cannot close file desctiptor: %m");
      (**pCVar7->_vptr_ContextManager)(pCVar7,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    iVar5 = ::mount((__p->_M_pathname)._M_dataplus._M_p,(ppVar1->_M_pathname)._M_dataplus._M_p,
                    "none",uVar6,"");
    if (iVar5 < 0) {
      pCVar7 = ContextManager::get();
      format_abi_cxx11_(&local_b0._M_pathname,"Cannot mount %s: %m",
                        (ppVar1->_M_pathname)._M_dataplus._M_p);
      (**pCVar7->_vptr_ContextManager)(pCVar7,&local_b0);
      goto LAB_00118348;
    }
  }
  this->mounted_ = true;
LAB_00118393:
  if (local_88._M_value != 0) {
    pCVar7 = ContextManager::get();
    pcVar3 = (__p->_M_pathname)._M_dataplus._M_p;
    (**(code **)(*(long *)local_88._M_cat + 0x20))(&local_70,local_88._M_cat,local_88._M_value);
    format_abi_cxx11_(&local_b0._M_pathname,"Cannot stat %s: %s",pcVar3,local_70._M_dataplus._M_p);
    (**pCVar7->_vptr_ContextManager)(pCVar7,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    iVar5 = std::__cxx11::string::~string((string *)&local_70);
  }
  return iVar5;
}

Assistant:

void Bind::mount(const fs::path &root_dir, const fs::path &work_dir) {
    set_paths(root_dir, work_dir);
    unsigned long mount_flags = (MS_BIND | MS_REC);
    if (!(flags_ & Rules::RW)) {
        mount_flags |= MS_RDONLY;
    }
    if (!(flags_ & Rules::DEV)) {
        mount_flags |= MS_NODEV;
    }
    if (flags_ & Rules::NOEXEC) {
        mount_flags |= MS_NOEXEC;
    }
    if (!(flags_ & Rules::SUID)) {
        mount_flags |= MS_NOSUID;
    }

    bool optional = (flags_ & Rules::OPT);

    std::error_code error;
    if (!fs::exists(from_, error)) {
        if (optional) return;
        die(format("%s not exists", from_.c_str()));
    }

    if (fs::is_directory(from_, error)) {
        fs::create_directories(to_, error);
        if (error) {
            die(format("Cannot create dir %s for mount point: %s", to_.c_str(), error.message().c_str()));
        }
        if (::mount(from_.c_str(), to_.c_str(), "none", mount_flags, "") < 0) {
            die(format("Cannot mount %s: %m", to_.c_str()));
        }
        mounted_ = true;
    } else if (fs::is_regular_file(from_, error)) {
        fs::create_directories(to_.parent_path(), error);
        if (error) {
            die(format("Cannot create dir %s: %s", from_.parent_path().c_str(), error.message().c_str()));
        }
        int fd = open(to_.c_str(), O_CREAT | O_WRONLY | O_TRUNC);
        if (fd < 0) {
            die(format("Cannot create file %s for mount point: %m", to_.c_str()));
        }
        if (close(fd) < 0) {
            die(format("Cannot close file desctiptor: %m"));
        }
        if (::mount(from_.c_str(), to_.c_str(), "none", mount_flags, "") < 0) {
            die(format("Cannot mount %s: %m", to_.c_str()));
        }
        mounted_ = true;
    } else {
        die(format("%s is not directory nor regular file", to_.c_str()));
    }
    if (error) {
        die(format("Cannot stat %s: %s", from_.c_str(), error.message().c_str()));
    }
}